

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  uint uVar1;
  undefined8 *puVar2;
  Rep *pRVar3;
  RepeatedPtrFieldBase *pRVar4;
  string *psVar5;
  ulong uVar6;
  LogMessageFatal local_20 [16];
  
  uVar1 = this->current_size_;
  pRVar4 = this;
  if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
    pRVar3 = rep(this);
    pRVar4 = (RepeatedPtrFieldBase *)pRVar3->elements;
  }
  if (0 < (int)uVar1) {
    uVar6 = 0;
    do {
      puVar2 = (undefined8 *)(&pRVar4->tagged_rep_or_elem_)[uVar6];
      uVar6 = uVar6 + 1;
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    } while (uVar1 != uVar6);
    this->current_size_ = 0;
    return;
  }
  psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                     ((long)(int)uVar1,0,"n > 0");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,0x2a8,*(undefined8 *)(psVar5 + 8),*(undefined8 *)psVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

PROTOBUF_NOINLINE void ClearNonEmpty() {
    const int n = current_size_;
    void* const* elems = elements();
    int i = 0;
    ABSL_DCHECK_GT(n, 0);
    // do/while loop to avoid initial test because we know n > 0
    do {
      TypeHandler::Clear(cast<TypeHandler>(elems[i++]));
    } while (i < n);
    ExchangeCurrentSize(0);
  }